

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_matrix.c
# Opt level: O2

void SUNMatDestroy(SUNMatrix A)

{
  SUNMatrix_Ops __ptr;
  
  if (A == (SUNMatrix)0x0) {
    return;
  }
  __ptr = A->ops;
  if ((__ptr != (SUNMatrix_Ops)0x0) && (__ptr->destroy != (_func_void_SUNMatrix *)0x0)) {
    (*__ptr->destroy)(A);
    return;
  }
  if (A->content != (void *)0x0) {
    free(A->content);
    A->content = (void *)0x0;
    __ptr = A->ops;
  }
  free(__ptr);
  free(A);
  return;
}

Assistant:

void SUNMatDestroy(SUNMatrix A)
{
  if (A == NULL) { return; }

  /* if the destroy operation exists use it */
  if (A->ops)
  {
    if (A->ops->destroy)
    {
      A->ops->destroy(A);
      return;
    }
  }

  /* if we reach this point, either ops == NULL or destroy == NULL,
     try to cleanup by freeing the content, ops, and matrix */
  if (A->content)
  {
    free(A->content);
    A->content = NULL;
  }
  if (A->ops)
  {
    free(A->ops);
    A->ops = NULL;
  }
  free(A);
  A = NULL;

  return;
}